

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_arena.pb.cc
# Opt level: O0

void __thiscall proto2_arena_unittest::ArenaMessage::~ArenaMessage(ArenaMessage *this)

{
  ArenaMessage *this_local;
  
  ~ArenaMessage(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

ArenaMessage::~ArenaMessage() {
  // @@protoc_insertion_point(destructor:proto2_arena_unittest.ArenaMessage)
  SharedDtor(*this);
}